

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::Server::stop(Server *this)

{
  int sock;
  
  if (this->is_running_ != true) {
    return;
  }
  sock = this->svr_sock_;
  if (sock != -1) {
    this->svr_sock_ = -1;
    detail::shutdown_socket(sock);
    close(sock);
    return;
  }
  __assert_fail("svr_sock_ != INVALID_SOCKET",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ivanenko[P]ydisk_commander/httplib.h"
                ,0x650,"void httplib::Server::stop()");
}

Assistant:

inline void Server::stop()
{
    if (is_running_) {
        assert(svr_sock_ != INVALID_SOCKET);
        auto sock = svr_sock_;
        svr_sock_ = INVALID_SOCKET;
        detail::shutdown_socket(sock);
        detail::close_socket(sock);
    }
}